

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1522.c
# Opt level: O0

int test(char *URL)

{
  long local_30;
  curl_off_t uploadSize;
  CURL *pCurl;
  curl_slist *pHeaderList;
  char *pcStack_10;
  CURLcode code;
  char *URL_local;
  
  pCurl = (CURL *)0x0;
  pcStack_10 = URL;
  uploadSize = curl_easy_init();
  memset(g_Data,0x41,0xa000);
  curl_easy_setopt(uploadSize,0x4eb4,sockopt_callback);
  curl_easy_setopt(uploadSize,0x2712,pcStack_10);
  curl_easy_setopt(uploadSize,0x271f,g_Data);
  curl_easy_setopt(uploadSize,0x3c,0xa000);
  pCurl = (CURL *)curl_slist_append(pCurl,"Expect:");
  curl_easy_setopt(uploadSize,0x2727,pCurl);
  pHeaderList._4_4_ = curl_easy_perform(uploadSize);
  if (pHeaderList._4_4_ == 0) {
    curl_easy_getinfo(uploadSize,0x600007,&local_30);
    curl_mprintf("uploadSize = %ld\n",local_30);
    if (local_30 == 0xa000) {
      curl_mprintf("!!!!!!!!!! PASS\n");
    }
    else {
      curl_mprintf("!!!!!!!!!! FAIL\n");
    }
  }
  else {
    curl_mprintf("curl_easy_perform() failed. e = %d\n",pHeaderList._4_4_);
  }
  curl_slist_free_all(pCurl);
  curl_easy_cleanup(uploadSize);
  return 0;
}

Assistant:

int test(char *URL)
{
  CURLcode code;
  struct curl_slist *pHeaderList = NULL;
  CURL *pCurl = curl_easy_init();
  memset(g_Data, 'A', sizeof(g_Data)); /* send As! */

  curl_easy_setopt(pCurl, CURLOPT_SOCKOPTFUNCTION, sockopt_callback);
  curl_easy_setopt(pCurl, CURLOPT_URL, URL);
  curl_easy_setopt(pCurl, CURLOPT_POSTFIELDS, g_Data);
  curl_easy_setopt(pCurl, CURLOPT_POSTFIELDSIZE, (long)sizeof(g_Data));

  /* Remove "Expect: 100-continue" */
  pHeaderList = curl_slist_append(pHeaderList, "Expect:");

  curl_easy_setopt(pCurl, CURLOPT_HTTPHEADER, pHeaderList);

  code = curl_easy_perform(pCurl);

  if(code == CURLE_OK) {
    curl_off_t uploadSize;
    curl_easy_getinfo(pCurl, CURLINFO_SIZE_UPLOAD_T, &uploadSize);

    printf("uploadSize = %ld\n", (long)uploadSize);

    if((size_t) uploadSize == sizeof(g_Data)) {
      printf("!!!!!!!!!! PASS\n");
    }
    else {
      printf("!!!!!!!!!! FAIL\n");
    }
  }
  else {
    printf("curl_easy_perform() failed. e = %d\n", code);
  }

  curl_slist_free_all(pHeaderList);
  curl_easy_cleanup(pCurl);

  return 0;
}